

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O3

void __thiscall BufferPool_SmallBuffers_Test::TestBody(BufferPool_SmallBuffers_Test *this)

{
  BufferPool *this_00;
  FreeNode *pFVar1;
  char *pcVar2;
  FreeNode *pFVar3;
  long lVar4;
  size_t i;
  long lVar5;
  void *ptr;
  FreeNode *pFVar6;
  BufferPool local_118 [4];
  BufferPool local_58;
  
  memt::BufferPool::BufferPool(local_118,1);
  memt::BufferPool::BufferPool(local_118 + 1,2);
  memt::BufferPool::BufferPool(local_118 + 2,3);
  memt::BufferPool::BufferPool(local_118 + 3,4);
  memt::BufferPool::BufferPool(&local_58,5);
  lVar5 = 0;
  do {
    this_00 = local_118 + lVar5;
    pFVar6 = local_118[lVar5]._free;
    if (pFVar6 == (FreeNode *)0x0) {
      pFVar6 = (FreeNode *)local_118[lVar5]._blocks._block._position;
      if (pFVar6 == (FreeNode *)local_118[lVar5]._blocks._block._end) {
        memt::BufferPool::growCapacity(this_00);
        pFVar3 = local_118[lVar5]._free;
        pFVar6 = (FreeNode *)local_118[lVar5]._blocks._block._position;
      }
      else {
        pFVar3 = (FreeNode *)0x0;
      }
      local_118[lVar5]._blocks._block._position =
           (char *)((long)&pFVar6->next + this_00->_bufferSize);
    }
    else {
      pFVar3 = pFVar6->next;
    }
    pFVar6->next = pFVar3;
    local_118[lVar5]._free = pFVar3;
    if (pFVar3 == (FreeNode *)0x0) {
      pFVar3 = (FreeNode *)local_118[lVar5]._blocks._block._position;
      if (pFVar3 == (FreeNode *)local_118[lVar5]._blocks._block._end) {
        memt::BufferPool::growCapacity(this_00);
        pFVar1 = local_118[lVar5]._free;
        pFVar3 = (FreeNode *)local_118[lVar5]._blocks._block._position;
      }
      else {
        pFVar1 = (FreeNode *)0x0;
      }
      local_118[lVar5]._blocks._block._position =
           (char *)((long)&pFVar3->next + this_00->_bufferSize);
    }
    else {
      pFVar1 = pFVar3->next;
      local_118[lVar5]._free = pFVar1;
    }
    if (pFVar1 == (FreeNode *)0x0) {
      pcVar2 = local_118[lVar5]._blocks._block._position;
      if (pcVar2 == local_118[lVar5]._blocks._block._end) {
        memt::BufferPool::growCapacity(this_00);
        pFVar1 = local_118[lVar5]._free;
        pcVar2 = local_118[lVar5]._blocks._block._position;
      }
      else {
        pFVar1 = (FreeNode *)0x0;
      }
      local_118[lVar5]._blocks._block._position = pcVar2 + this_00->_bufferSize;
    }
    else {
      pFVar1 = pFVar1->next;
    }
    pFVar3->next = pFVar1;
    local_118[lVar5]._free = pFVar3;
    lVar4 = 10000;
    do {
      if (pFVar3 == (FreeNode *)0x0) {
        pcVar2 = local_118[lVar5]._blocks._block._position;
        if (pcVar2 == local_118[lVar5]._blocks._block._end) {
          memt::BufferPool::growCapacity(this_00);
          pcVar2 = local_118[lVar5]._blocks._block._position;
        }
        local_118[lVar5]._blocks._block._position = pcVar2 + this_00->_bufferSize;
      }
      else {
        local_118[lVar5]._free = pFVar3->next;
      }
      pFVar3 = local_118[lVar5]._free;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    pFVar6->next = pFVar3;
    local_118[lVar5]._free = pFVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  lVar5 = 0xd0;
  do {
    memt::MemoryBlocks::freeAllBlocks((MemoryBlocks *)((long)&local_118[0]._bufferSize + lVar5));
    lVar5 = lVar5 + -0x30;
  } while (lVar5 != -0x20);
  return;
}

Assistant:

TEST(BufferPool, SmallBuffers) {
  memt::BufferPool pools[] = {1, 2, 3, 4, 5};
  for (size_t i = 0; i < sizeof(pools) / sizeof(memt::BufferPool); ++i) {
    memt::BufferPool& pool = pools[i];
    void* a = pool.alloc();
    pool.free(a);
    void* b = pool.alloc();
    void* c = pool.alloc();
    pool.alloc();
    pool.free(c);
    for (size_t i = 0; i < 10000; ++i)
      pool.alloc();
    pool.free(b);
  }
}